

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_reader.cpp
# Opt level: O3

void __thiscall duckdb::ParquetReader::InitializeSchema(ParquetReader *this,ClientContext *context)

{
  unique_ptr<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>,_true>
  *this_00;
  _Head_base<0UL,_const_duckdb_parquet::FileMetaData_*,_false> file_meta_data;
  _Head_base<0UL,_duckdb::ParquetColumnSchema_*,_false> __ptr;
  pointer pcVar1;
  ParquetFileMetadataCache *pPVar2;
  pointer pPVar3;
  reference element;
  InvalidInputException *pIVar4;
  size_type __n;
  undefined1 local_108 [32];
  LogicalType local_e8;
  vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
  local_d0;
  __uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_> local_b8
  ;
  Value local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pPVar2 = shared_ptr<duckdb::ParquetFileMetadataCache,_true>::operator->(&this->metadata);
  file_meta_data._M_head_impl =
       (pPVar2->metadata).
       super_unique_ptr<const_duckdb_parquet::FileMetaData,_std::default_delete<const_duckdb_parquet::FileMetaData>_>
       ._M_t.
       super___uniq_ptr_impl<const_duckdb_parquet::FileMetaData,_std::default_delete<const_duckdb_parquet::FileMetaData>_>
       ._M_t.
       super__Tuple_impl<0UL,_const_duckdb_parquet::FileMetaData_*,_std::default_delete<const_duckdb_parquet::FileMetaData>_>
       .super__Head_base<0UL,_const_duckdb_parquet::FileMetaData_*,_false>._M_head_impl;
  if ((((byte)(file_meta_data._M_head_impl)->__isset & 8) != 0) &&
     (((byte)*(_EncryptionAlgorithm__isset *)
              ((long)&(file_meta_data._M_head_impl)->encryption_algorithm + 0xa8) & 2) != 0)) {
    pIVar4 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    local_108._0_8_ = local_108 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_108,
               "File \'%s\' is encrypted with AES_GCM_CTR_V1, but only AES_GCM_V1 is supported","");
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    pcVar1 = (this->super_BaseFileReader).file.path._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar1,
               pcVar1 + (this->super_BaseFileReader).file.path._M_string_length);
    InvalidInputException::InvalidInputException<std::__cxx11::string>
              (pIVar4,(string *)local_108,&local_50);
    __cxa_throw(pIVar4,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (1 < (ulong)(((long)*(pointer *)((long)&(file_meta_data._M_head_impl)->schema + 8) -
                   (long)((file_meta_data._M_head_impl)->schema).
                         super_vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
                         .
                         super__Vector_base<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7063e7063e7063e7)) {
    ParseSchema((ParquetReader *)local_108);
    this_00 = &this->root_schema;
    __ptr._M_head_impl =
         (this->root_schema).
         super_unique_ptr<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParquetColumnSchema_*,_std::default_delete<duckdb::ParquetColumnSchema>_>
         .super__Head_base<0UL,_duckdb::ParquetColumnSchema_*,_false>._M_head_impl;
    (this->root_schema).
    super_unique_ptr<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>_>
    ._M_t.
    super___uniq_ptr_impl<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::ParquetColumnSchema_*,_std::default_delete<duckdb::ParquetColumnSchema>_>
    .super__Head_base<0UL,_duckdb::ParquetColumnSchema_*,_false>._M_head_impl =
         (ParquetColumnSchema *)local_108._0_8_;
    if (__ptr._M_head_impl != (ParquetColumnSchema *)0x0) {
      ::std::default_delete<duckdb::ParquetColumnSchema>::operator()
                ((default_delete<duckdb::ParquetColumnSchema> *)this_00,__ptr._M_head_impl);
    }
    pPVar3 = unique_ptr<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>,_true>
             ::operator->(this_00);
    if ((pPVar3->children).
        super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
        super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (pPVar3->children).
        super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>.
        super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      __n = 0;
      do {
        pPVar3 = unique_ptr<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>,_true>
                 ::operator->(this_00);
        element = vector<duckdb::ParquetColumnSchema,_true>::operator[](&pPVar3->children,__n);
        ParseColumnDefinition
                  ((MultiFileColumnDefinition *)local_108,this,file_meta_data._M_head_impl,element);
        ::std::
        vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
        ::emplace_back<duckdb::MultiFileColumnDefinition>
                  (&(this->super_BaseFileReader).columns.
                    super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                   ,(MultiFileColumnDefinition *)local_108);
        Value::~Value(&local_b0);
        if ((_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
             )local_b8._M_t.
              super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
              .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
            (ParsedExpression *)0x0) {
          (**(code **)(*(long *)local_b8._M_t.
                                super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                                .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>.
                                _M_head_impl + 8))();
        }
        local_b8._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
             (tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)
             (_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
              )0x0;
        ::std::
        vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
        ::~vector(&local_d0);
        LogicalType::~LogicalType(&local_e8);
        if ((ParquetColumnSchema *)local_108._0_8_ != (ParquetColumnSchema *)(local_108 + 0x10)) {
          operator_delete((void *)local_108._0_8_);
        }
        __n = __n + 1;
        pPVar3 = unique_ptr<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>,_true>
                 ::operator->(this_00);
      } while (__n < (ulong)(((long)(pPVar3->children).
                                    super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                                    .
                                    super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pPVar3->children).
                                    super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                                    .
                                    super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4) *
                            -0x71c71c71c71c71c7));
    }
    return;
  }
  pIVar4 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  local_108._0_8_ = local_108 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_108,
             "Failed to read Parquet file \'%s\': Need at least one non-root column in the file","")
  ;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  pcVar1 = (this->super_BaseFileReader).file.path._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,
             pcVar1 + (this->super_BaseFileReader).file.path._M_string_length);
  InvalidInputException::InvalidInputException<std::__cxx11::string>
            (pIVar4,(string *)local_108,&local_70);
  __cxa_throw(pIVar4,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void ParquetReader::InitializeSchema(ClientContext &context) {
	auto file_meta_data = GetFileMetadata();

	if (file_meta_data->__isset.encryption_algorithm) {
		if (file_meta_data->encryption_algorithm.__isset.AES_GCM_CTR_V1) {
			throw InvalidInputException("File '%s' is encrypted with AES_GCM_CTR_V1, but only AES_GCM_V1 is supported",
			                            GetFileName());
		}
	}
	// check if we like this schema
	if (file_meta_data->schema.size() < 2) {
		throw InvalidInputException("Failed to read Parquet file '%s': Need at least one non-root column in the file",
		                            GetFileName());
	}
	root_schema = ParseSchema();
	for (idx_t i = 0; i < root_schema->children.size(); i++) {
		auto &element = root_schema->children[i];
		columns.push_back(ParseColumnDefinition(*file_meta_data, element));
	}
}